

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::Framebuffer::Resources::Resources
          (Resources *this,Environment *env,Parameters *param_2)

{
  Parameters *params;
  Parameters local_8c;
  
  local_8c.image.flags = 0;
  local_8c.image.imageType = VK_IMAGE_TYPE_2D;
  local_8c.image.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_8c.image.extent.width = 0x100;
  local_8c.image.extent.height = 0x100;
  local_8c.image.extent.depth = 1;
  local_8c.image.mipLevels = 1;
  local_8c.image.arraySize = 1;
  local_8c.image.samples = VK_SAMPLE_COUNT_1_BIT;
  local_8c.image.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_8c.image.usage = 0x10;
  local_8c.image.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_8c.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_8c.components.r = VK_COMPONENT_SWIZZLE_R;
  local_8c.components.g = VK_COMPONENT_SWIZZLE_G;
  local_8c.components.b = VK_COMPONENT_SWIZZLE_B;
  local_8c.components.a = VK_COMPONENT_SWIZZLE_A;
  local_8c.subresourceRange.aspectMask = 1;
  local_8c.subresourceRange.baseMipLevel = 0;
  local_8c.subresourceRange.levelCount = 1;
  local_8c.subresourceRange.baseArrayLayer = 0;
  local_8c.format = local_8c.image.format;
  local_8c.subresourceRange.layerCount = 1;
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->colorAttachment,env,&local_8c);
  local_8c.image.flags = 0;
  local_8c.image.imageType = VK_IMAGE_TYPE_2D;
  local_8c.image.format = VK_FORMAT_D16_UNORM;
  local_8c.image.extent.width = 0x100;
  local_8c.image.extent.height = 0x100;
  local_8c.image.extent.depth = 1;
  local_8c.image.mipLevels = 1;
  local_8c.image.arraySize = 1;
  local_8c.image.samples = VK_SAMPLE_COUNT_1_BIT;
  local_8c.image.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_8c.image.usage = 0x20;
  local_8c.image.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_8c.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_8c.components.r = VK_COMPONENT_SWIZZLE_R;
  local_8c.components.g = VK_COMPONENT_SWIZZLE_G;
  local_8c.components.b = VK_COMPONENT_SWIZZLE_B;
  local_8c.components.a = VK_COMPONENT_SWIZZLE_A;
  local_8c.subresourceRange.aspectMask = 2;
  local_8c.subresourceRange.baseMipLevel = 0;
  local_8c.subresourceRange.levelCount = 1;
  local_8c.subresourceRange.baseArrayLayer = 0;
  local_8c.format = local_8c.image.format;
  local_8c.subresourceRange.layerCount = 1;
  Dependency<vkt::api::(anonymous_namespace)::ImageView>::Dependency
            (&this->depthStencilAttachment,env,&local_8c);
  Dependency<vkt::api::(anonymous_namespace)::RenderPass>::Dependency(&this->renderPass,env,params);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters&)
			: colorAttachment			(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_R8G8B8A8_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, 1u)))
			, depthStencilAttachment	(env, ImageView::Parameters(Image::Parameters(0u, VK_IMAGE_TYPE_2D, VK_FORMAT_D16_UNORM,
																					  makeExtent3D(256, 256, 1),
																					  1u, 1u,
																					  VK_SAMPLE_COUNT_1_BIT,
																					  VK_IMAGE_TILING_OPTIMAL,
																					  VK_IMAGE_USAGE_DEPTH_STENCIL_ATTACHMENT_BIT,
																					  VK_IMAGE_LAYOUT_UNDEFINED),
																		 VK_IMAGE_VIEW_TYPE_2D, VK_FORMAT_D16_UNORM,
																		 makeComponentMappingRGBA(),
																		 makeImageSubresourceRange(VK_IMAGE_ASPECT_DEPTH_BIT, 0u, 1u, 0u, 1u)))
			, renderPass				(env, RenderPass::Parameters())
		{}